

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryAnim(aiAnimation *anim)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  aiNodeAnim *nd;
  uint a;
  uint32_t old;
  uint32_t len;
  aiAnimation *anim_local;
  
  ofs = WriteMagic(0x123b);
  uVar1 = Write<aiString>(&anim->mName);
  uVar2 = Write<double>(&anim->mDuration);
  uVar3 = Write<double>(&anim->mTicksPerSecond);
  uVar4 = Write<unsigned_int>(&anim->mNumChannels);
  a = uVar4 + uVar3 + uVar2 + uVar1;
  for (nd._4_4_ = 0; nd._4_4_ < anim->mNumChannels; nd._4_4_ = nd._4_4_ + 1) {
    uVar1 = WriteBinaryNodeAnim(anim->mChannels[nd._4_4_]);
    a = uVar1 + 8 + a;
  }
  ChangeInteger(ofs,a);
  return a;
}

Assistant:

uint32_t WriteBinaryAnim(const aiAnimation* anim)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIANIMATION);

	len += Write<aiString> (anim->mName);
	len += Write<double> (anim->mDuration);
	len += Write<double> (anim->mTicksPerSecond);
	len += Write<unsigned int>(anim->mNumChannels);

	for (unsigned int a = 0; a < anim->mNumChannels;++a) {
		const aiNodeAnim* nd = anim->mChannels[a];
		len += WriteBinaryNodeAnim(nd)+8;	
	}

	ChangeInteger(old,len);
	return len;
}